

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::Com_Mute(IResult *pResult,void *pContext)

{
  long lVar1;
  int iVar2;
  IBlacklist *pIVar3;
  long lVar4;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool isMuted;
  int TargetID;
  CChat *pChatData;
  SCommandContext *pCommandContext;
  char aMsg [128];
  char *local_c8;
  CChat *in_stack_ffffffffffffff40;
  char *buffer;
  CGameClient *this;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar5;
  char local_88 [68];
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  CChat *in_stack_ffffffffffffffd0;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RSI + 0x18);
  this = *(CGameClient **)(lVar1 + 8);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  iVar2 = CGameClient::GetClientID(this,(char *)in_stack_ffffffffffffff40);
  if (iVar2 != -1) {
    uVar5 = CONCAT13(*(undefined1 *)(*(long *)(lVar1 + 8) + (long)iVar2 * 0x5b0 + 0x4aed),
                     (int3)in_stack_ffffffffffffff50) & 0x1ffffff;
    if ((char)(uVar5 >> 0x18) == '\0') {
      pIVar3 = CGameClient::Blacklist(*(CGameClient **)(lVar1 + 8));
      (*(pIVar3->super_IInterface)._vptr_IInterface[4])
                (pIVar3,*(long *)(lVar1 + 8) + 0x4540 + (long)iVar2 * 0x5b0,
                 *(long *)(lVar1 + 8) + (long)iVar2 * 0x5b0 + 0x4581);
    }
    else {
      pIVar3 = CGameClient::Blacklist(*(CGameClient **)(lVar1 + 8));
      (*(pIVar3->super_IInterface)._vptr_IInterface[5])
                (pIVar3,*(long *)(lVar1 + 8) + 0x4540 + (long)iVar2 * 0x5b0,
                 *(long *)(lVar1 + 8) + (long)iVar2 * 0x5b0 + 0x4581);
    }
    lVar4 = *(long *)(lVar1 + 8) + 0x4540 + (long)iVar2 * 0x5b0;
    *(bool *)(lVar4 + 0x5ad) = (*(byte *)(lVar4 + 0x5ad) & 1) != 1;
    ClearInput(in_stack_ffffffffffffff40);
    buffer = local_88;
    if ((uVar5 & 0x1000000) == 0) {
      local_c8 = Localize((char *)CONCAT44(iVar2,uVar5),(char *)this);
    }
    else {
      local_c8 = Localize((char *)CONCAT44(iVar2,uVar5),(char *)this);
    }
    str_format(buffer,0x80,local_c8,*(long *)(lVar1 + 8) + 0x4540 + (long)iVar2 * 0x5b0);
    AddLine(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
            in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  Disable((CChat *)0x14c62e);
  (**(code **)(**(long **)(lVar1 + 8) + 0xb8))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::Com_Mute(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		bool isMuted = pChatData->m_pClient->m_aClients[TargetID].m_ChatIgnore;
		if(isMuted)
			pChatData->m_pClient->Blacklist()->RemoveIgnoredPlayer(pChatData->m_pClient->m_aClients[TargetID].m_aName, pChatData->m_pClient->m_aClients[TargetID].m_aClan);
		else
			pChatData->m_pClient->Blacklist()->AddIgnoredPlayer(pChatData->m_pClient->m_aClients[TargetID].m_aName, pChatData->m_pClient->m_aClients[TargetID].m_aClan);
		pChatData->m_pClient->m_aClients[TargetID].m_ChatIgnore ^= 1;

		pChatData->ClearInput();

		char aMsg[128];
		str_format(aMsg, sizeof(aMsg), !isMuted ? Localize("'%s' was muted") : Localize("'%s' was unmuted"), pChatData->m_pClient->m_aClients[TargetID].m_aName);
		pChatData->AddLine(aMsg, CLIENT_MSG, CHAT_ALL);
	}
	pChatData->Disable();
	pChatData->m_pClient->OnRelease();
}